

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedFixed<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int old_size;
  char *pcVar10;
  int *piVar11;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  string *psVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  ParseContext *ctx_00;
  ushort *p;
  uint uVar15;
  uint *puVar17;
  LongSooRep *this;
  pair<const_char_*,_unsigned_int> pVar18;
  LogMessageFatal local_40 [16];
  uint uVar16;
  
  puVar17 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar17 & 3) != 0) goto LAB_0015b82c;
  uVar16 = data.field_0._0_4_;
  uVar15 = uVar16 & 7;
  if (uVar15 == 2) {
    pcVar10 = MpPackedFixed<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  uVar7 = *(ushort *)((long)puVar17 + 10) & 0x1c0;
  if ((ulong)uVar7 == 0xc0) {
    if (uVar15 != 1) {
LAB_0015b778:
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_0015b7c6;
    }
    this = (LongSooRep *)((long)&msg->_vptr_MessageLite + (ulong)*puVar17);
    if (((ulong)this & 7) != 0) {
LAB_0015b86d:
      AlignFail(this);
    }
    do {
      uVar3 = *(undefined8 *)ptr;
      uVar12 = this->elements_int;
      iVar8 = SooRep::size((SooRep *)this,(uVar12 & 4) == 0);
      iVar9 = 1;
      if ((this->elements_int & 4) != 0) {
        iVar9 = this->capacity;
      }
      if (iVar8 == iVar9) {
        RepeatedField<unsigned_long>::Grow
                  ((RepeatedField<unsigned_long> *)this,(uVar12 & 4) == 0,iVar8,iVar8 + 1);
LAB_0015b560:
        piVar11 = (int *)LongSooRep::elements(this);
        bVar6 = false;
      }
      else {
        bVar6 = true;
        piVar11 = &this->size;
        if ((uVar12 & 4) != 0) goto LAB_0015b560;
      }
      iVar9 = SooRep::size((SooRep *)this,bVar6);
      if ((iVar9 != iVar8 + 1) && ((this->elements_int & 4) != 0)) {
        LongSooRep::elements(this);
      }
      RepeatedField<unsigned_long>::set_size((RepeatedField<unsigned_long> *)this,bVar6,iVar8 + 1);
      *(undefined8 *)(piVar11 + (long)iVar9 * 2) = uVar3;
      p = (ushort *)(ptr + 8);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_0015b7d6;
      bVar1 = ptr[8];
      auVar4[8] = bVar1;
      auVar4._0_8_ = ptr + 9;
      auVar4._9_3_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = ptr[9];
        aVar14.data = (ulong)bVar2 << 7;
        uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pcVar10 = (char *)(ulong)uVar15;
          pVar18 = ReadTagFallback((char *)p,uVar15);
          auVar4 = pVar18._0_12_;
          ctx_00 = pVar18._8_8_;
          if (pVar18.first == (char *)0x0) {
LAB_0015b80a:
            pcVar10 = Error(msg,pcVar10,ctx_00,(TcFieldData)aVar14,table,hasbits);
            return pcVar10;
          }
        }
        else {
          auVar4._8_4_ = uVar15;
          auVar4._0_8_ = ptr + 10;
        }
      }
      ptr = auVar4._0_8_;
    } while (auVar4._8_4_ == uVar16);
  }
  else {
    if (uVar7 != 0x80) {
      psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar7,0x80,
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x6fb,*(undefined8 *)(psVar13 + 8),*(undefined8 *)psVar13);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
    }
    if (uVar15 != 5) goto LAB_0015b778;
    this = (LongSooRep *)((long)&msg->_vptr_MessageLite + (ulong)*puVar17);
    if (((ulong)this & 7) != 0) goto LAB_0015b86d;
    do {
      iVar9 = *(int *)ptr;
      uVar12 = this->elements_int;
      old_size = SooRep::size((SooRep *)this,(uVar12 & 4) == 0);
      iVar8 = 2;
      if ((this->elements_int & 4) != 0) {
        iVar8 = this->capacity;
      }
      if (old_size == iVar8) {
        RepeatedField<unsigned_int>::Grow
                  ((RepeatedField<unsigned_int> *)this,(uVar12 & 4) == 0,old_size,old_size + 1);
LAB_0015b6ad:
        piVar11 = (int *)LongSooRep::elements(this);
        bVar6 = false;
      }
      else {
        bVar6 = true;
        piVar11 = &this->size;
        if ((uVar12 & 4) != 0) goto LAB_0015b6ad;
      }
      iVar8 = SooRep::size((SooRep *)this,bVar6);
      if ((iVar8 != old_size + 1) && ((this->elements_int & 4) != 0)) {
        LongSooRep::elements(this);
      }
      RepeatedField<unsigned_int>::set_size((RepeatedField<unsigned_int> *)this,bVar6,old_size + 1);
      piVar11[iVar8] = iVar9;
      p = (ushort *)((long)ptr + 4);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_0015b7d6;
      bVar1 = *(byte *)((long)ptr + 4);
      auVar5[8] = bVar1;
      auVar5._0_8_ = (byte *)((long)ptr + 5);
      auVar5._9_3_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)((long)ptr + 5);
        aVar14.data = (ulong)bVar2 << 7;
        uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pcVar10 = (char *)(ulong)uVar15;
          pVar18 = ReadTagFallback((char *)p,uVar15);
          auVar5 = pVar18._0_12_;
          ctx_00 = pVar18._8_8_;
          if (pVar18.first == (char *)0x0) goto LAB_0015b80a;
        }
        else {
          auVar5._8_4_ = uVar15;
          auVar5._0_8_ = (char *)((long)ptr + 6);
        }
      }
      ptr = auVar5._0_8_;
    } while (auVar5._8_4_ == uVar16);
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) {
LAB_0015b7d6:
    if ((ulong)table->has_bits_offset != 0) {
      puVar17 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar17 & 3) != 0) {
LAB_0015b82c:
        AlignFail();
      }
      *puVar17 = *puVar17 | (uint)hasbits;
    }
    return (char *)p;
  }
  uVar15 = (uint)table->fast_idx_mask & (uint)*p;
  if ((uVar15 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar12 = (ulong)(uVar15 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*p ^ *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar12);
  ptr = (char *)p;
LAB_0015b7c6:
  pcVar10 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}